

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

int secp256k1_ecmult_multi_var
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,size_t n)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  code *pcVar4;
  long lVar5;
  secp256k1_fe *rzr;
  ulong uVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong unaff_R15;
  bool bVar10;
  ulong local_878;
  secp256k1_strauss_state local_860;
  secp256k1_fe aux [8];
  secp256k1_strauss_point_state ps [1];
  secp256k1_ge pre_a [8];
  
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  (r->x).n[4] = 0;
  (r->y).n[0] = 0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  if (inp_g_sc != (secp256k1_scalar *)0x0 || n != 0) {
    if (n != 0) {
      if (scratch != (secp256k1_scratch *)0x0) {
        sVar2 = secp256k1_scratch_max_allocation(error_callback,scratch,6);
        lVar5 = 1;
        puVar7 = &DAT_00131f08;
        uVar9 = 0;
        do {
          if (lVar5 == 0xd) break;
          iVar1 = (int)lVar5;
          if (iVar1 - 1U < 0xc) {
            uVar6 = *puVar7;
          }
          else {
            uVar6 = 0;
          }
          bVar10 = false;
          uVar3 = (ulong)(iVar1 + 0x80) / (ulong)(iVar1 + 1);
          uVar8 = (0x80L << ((byte)lVar5 & 0x3f)) + uVar3 * 8 + 0x128;
          if (uVar8 <= sVar2) {
            uVar3 = (sVar2 - uVar8) / (uVar3 * 8 + 0x118);
            bVar10 = uVar6 <= uVar3;
            if (!bVar10) {
              uVar6 = uVar3;
            }
            if (uVar9 < uVar6) {
              uVar9 = uVar6;
            }
          }
          puVar7 = puVar7 + 1;
          lVar5 = lVar5 + 1;
        } while (bVar10);
        if (uVar9 != 0) {
          uVar6 = 5000000;
          if (uVar9 < 5000000) {
            uVar6 = uVar9;
          }
          local_878 = (n - 1) / uVar6 + 1;
          unaff_R15 = (n - 1) / local_878 + 1;
        }
        if (uVar9 != 0) {
          if (unaff_R15 < 0x58) {
            sVar2 = secp256k1_scratch_max_allocation(error_callback,scratch,5);
            if (0x8af < sVar2) {
              uVar9 = sVar2 / 0x8b0;
              if (4999999 < uVar9) {
                uVar9 = 5000000;
              }
              local_878 = (n - 1) / uVar9 + 1;
              unaff_R15 = (n - 1) / local_878 + 1;
            }
            if (sVar2 < 0x8b0) goto LAB_00117b6b;
            pcVar4 = secp256k1_ecmult_strauss_batch;
          }
          else {
            pcVar4 = secp256k1_ecmult_pippenger_batch;
          }
          lVar5 = 0;
          uVar9 = 0;
          while( true ) {
            uVar6 = unaff_R15;
            if (n < unaff_R15) {
              uVar6 = n;
            }
            rzr = (secp256k1_fe *)0x0;
            if (uVar9 == 0) {
              rzr = (secp256k1_fe *)inp_g_sc;
            }
            iVar1 = (*pcVar4)(error_callback,scratch,ps,rzr,cb,cbdata,uVar6,lVar5);
            if (iVar1 == 0) break;
            secp256k1_gej_add_var(r,r,(secp256k1_gej *)ps,rzr);
            n = n - uVar6;
            uVar9 = uVar9 + 1;
            lVar5 = lVar5 + unaff_R15;
            if (local_878 == uVar9) {
              return 1;
            }
          }
          return 0;
        }
      }
LAB_00117b6b:
      iVar1 = secp256k1_ecmult_multi_simple_var(r,inp_g_sc,cb,cbdata,n);
      return iVar1;
    }
    local_860.aux = aux;
    local_860.pre_a = pre_a;
    local_860.ps = ps;
    secp256k1_ecmult_strauss_wnaf(&local_860,r,1,r,&secp256k1_scalar_zero,inp_g_sc);
  }
  return 1;
}

Assistant:

static int secp256k1_ecmult_multi_var(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n) {
    size_t i;

    int (*f)(const secp256k1_callback* error_callback, secp256k1_scratch*, secp256k1_gej*, const secp256k1_scalar*, secp256k1_ecmult_multi_callback cb, void*, size_t, size_t);
    size_t n_batches;
    size_t n_batch_points;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n == 0) {
        return 1;
    } else if (n == 0) {
        secp256k1_ecmult(r, r, &secp256k1_scalar_zero, inp_g_sc);
        return 1;
    }
    if (scratch == NULL) {
        return secp256k1_ecmult_multi_simple_var(r, inp_g_sc, cb, cbdata, n);
    }

    /* Compute the batch sizes for Pippenger's algorithm given a scratch space. If it's greater than
     * a threshold use Pippenger's algorithm. Otherwise use Strauss' algorithm.
     * As a first step check if there's enough space for Pippenger's algo (which requires less space
     * than Strauss' algo) and if not, use the simple algorithm. */
    if (!secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, secp256k1_pippenger_max_points(error_callback, scratch), n)) {
        return secp256k1_ecmult_multi_simple_var(r, inp_g_sc, cb, cbdata, n);
    }
    if (n_batch_points >= ECMULT_PIPPENGER_THRESHOLD) {
        f = secp256k1_ecmult_pippenger_batch;
    } else {
        if (!secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, secp256k1_strauss_max_points(error_callback, scratch), n)) {
            return secp256k1_ecmult_multi_simple_var(r, inp_g_sc, cb, cbdata, n);
        }
        f = secp256k1_ecmult_strauss_batch;
    }
    for(i = 0; i < n_batches; i++) {
        size_t nbp = n < n_batch_points ? n : n_batch_points;
        size_t offset = n_batch_points*i;
        secp256k1_gej tmp;
        if (!f(error_callback, scratch, &tmp, i == 0 ? inp_g_sc : NULL, cb, cbdata, nbp, offset)) {
            return 0;
        }
        secp256k1_gej_add_var(r, r, &tmp, NULL);
        n -= nbp;
    }
    return 1;
}